

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O2

void __thiscall InjectPayloadCallfixup::restoreXml(InjectPayloadCallfixup *this,Element *el)

{
  Element *this_00;
  bool bVar1;
  string *__x;
  LowlevelError *this_01;
  bool bVar2;
  pointer ppEVar3;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"name",&local_61);
  Element::getAttributeValue(el,&local_50);
  local_60 = &(this->super_InjectPayloadSleigh).super_InjectPayload.name;
  std::__cxx11::string::_M_assign((string *)local_60);
  std::__cxx11::string::~string((string *)&local_50);
  local_58 = &this->targetSymbolNames;
  bVar2 = false;
  for (ppEVar3 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar3 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar3 = ppEVar3 + 1) {
    this_00 = *ppEVar3;
    bVar1 = std::operator==(&this_00->name,"pcode");
    if (bVar1) {
      InjectPayloadSleigh::restoreXml(&this->super_InjectPayloadSleigh,this_00);
      bVar2 = true;
    }
    else {
      bVar1 = std::operator==(&this_00->name,"target");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_50,"name",&local_61);
        __x = Element::getAttributeValue(this_00,&local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_58,__x);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  if (!bVar2) {
    this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::operator+(&local_50,"<callfixup> is missing <pcode> subtag: ",local_60);
    LowlevelError::LowlevelError(this_01,&local_50);
    __cxa_throw(this_01,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  return;
}

Assistant:

void InjectPayloadCallfixup::restoreXml(const Element *el)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  name = el->getAttributeValue("name");
  bool pcodeSubtag = false;

  for(iter=list.begin();iter!=list.end();++iter) {
    const Element *subel = *iter;
    if (subel->getName() == "pcode") {
      InjectPayloadSleigh::restoreXml(subel);
      pcodeSubtag = true;
    }
    else if (subel->getName() == "target")
      targetSymbolNames.push_back(subel->getAttributeValue("name"));
  }
  if (!pcodeSubtag)
    throw LowlevelError("<callfixup> is missing <pcode> subtag: "+name);
}